

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O2

void PrintEnterBlock(ExpressionGraphContext *ctx,InplaceStr name,ExprBase *node,char *format,...)

{
  TypeBase *pTVar1;
  char *pcVar2;
  SynBase *syntax;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  char in_AL;
  char *pcVar5;
  ModuleData *pMVar6;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b0 = in_R9;
  PrintIndent(ctx);
  if (name.begin != name.end) {
    OutputContext::Print(ctx->output,name.begin,(int)name.end - (int)name.begin);
    OutputContext::Print(ctx->output,": ");
  }
  pTVar1 = node->type;
  if (pTVar1 != (TypeBase *)0x0) {
    pcVar5 = (pTVar1->name).begin;
    pcVar2 = (pTVar1->name).end;
    if (pcVar5 != pcVar2) {
      OutputContext::Print(ctx->output,pcVar5,(int)pcVar2 - (int)pcVar5);
      OutputContext::Print(ctx->output," ");
    }
  }
  args[0].reg_save_area = local_d8;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x28;
  args[0].fp_offset = 0x30;
  OutputContext::Print(ctx->output,format,args);
  OutputContext::Print(ctx->output,'{');
  syntax = node->source;
  if ((syntax != (SynBase *)0x0) && (syntax->isInternal == false)) {
    pcVar5 = GetParseTreeNodeName(syntax);
    pLVar3 = node->source->begin;
    pLVar4 = node->source->end;
    Print(ctx," // %s [%d:%d]-[%d:%d]",pcVar5,(ulong)(pLVar3->line + 1),(ulong)pLVar3->column,
          (ulong)(pLVar4->line + 1),pLVar4->length + pLVar4->column);
    pMVar6 = ExpressionContext::GetSourceOwner(ctx->ctx,node->source->begin);
    if (pMVar6 != (ModuleData *)0x0) {
      Print(ctx," from \'%.*s\'",
            (ulong)(uint)(*(int *)&(pMVar6->name).end - (int)(pMVar6->name).begin));
    }
  }
  OutputContext::Print(ctx->output,'\n');
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ExpressionGraphContext &ctx, InplaceStr name, ExprBase *node, const char *format, ...)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(node->type && !node->type->name.empty())
	{
		ctx.output.Print(node->type->name.begin, unsigned(node->type->name.end - node->type->name.begin));
		ctx.output.Print(" ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	ctx.output.Print('{');

	if(node->source && !node->source->isInternal)
	{
		Print(ctx, " // %s [%d:%d]-[%d:%d]", GetParseTreeNodeName(node->source), node->source->begin->line + 1, node->source->begin->column, node->source->end->line + 1, node->source->end->column + node->source->end->length);

		if(ModuleData *importModule = ctx.ctx.GetSourceOwner(node->source->begin))
			Print(ctx, " from '%.*s'", FMT_ISTR(importModule->name));
	}

	ctx.output.Print('\n');

	ctx.depth++;
}